

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void opt_j(opt_state_t *opt_state,edge *ep)

{
  int iVar1;
  block *succ;
  uint local_2c;
  bpf_u_int32 x;
  block *target;
  int k;
  int i;
  edge *ep_local;
  opt_state_t *opt_state_local;
  
  if ((ep->succ->et).succ != (block *)0x0) {
    if (((ep->succ->et).succ == (ep->succ->ef).succ) &&
       (iVar1 = use_conflict(ep->pred,(ep->succ->et).succ), iVar1 == 0)) {
      opt_state->done = 0;
      ep->succ = (ep->succ->et).succ;
    }
LAB_00119db1:
    for (target._4_4_ = 0; target._4_4_ < opt_state->edgewords; target._4_4_ = target._4_4_ + 1) {
      local_2c = ep->edom[target._4_4_];
      while (local_2c != 0) {
        iVar1 = ffs(local_2c);
        local_2c = (1 << ((byte)(iVar1 + -1) & 0x1f) ^ 0xffffffffU) & local_2c;
        succ = fold_edge(ep->succ,opt_state->edges[iVar1 + -1 + target._4_4_ * 0x20]);
        if ((succ != (block *)0x0) && (iVar1 = use_conflict(ep->pred,succ), iVar1 == 0)) {
          opt_state->done = 0;
          ep->succ = succ;
          if ((succ->et).succ == (block *)0x0) {
            return;
          }
          goto LAB_00119db1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
opt_j(opt_state_t *opt_state, struct edge *ep)
{
	register int i, k;
	register struct block *target;

	if (JT(ep->succ) == 0)
		return;

	if (JT(ep->succ) == JF(ep->succ)) {
		/*
		 * Common branch targets can be eliminated, provided
		 * there is no data dependency.
		 */
		if (!use_conflict(ep->pred, ep->succ->et.succ)) {
			opt_state->done = 0;
			ep->succ = JT(ep->succ);
		}
	}
	/*
	 * For each edge dominator that matches the successor of this
	 * edge, promote the edge successor to the its grandchild.
	 *
	 * XXX We violate the set abstraction here in favor a reasonably
	 * efficient loop.
	 */
 top:
	for (i = 0; i < opt_state->edgewords; ++i) {
		register bpf_u_int32 x = ep->edom[i];

		while (x != 0) {
			k = ffs(x) - 1;
			x &=~ (1 << k);
			k += i * BITS_PER_WORD;

			target = fold_edge(ep->succ, opt_state->edges[k]);
			/*
			 * Check that there is no data dependency between
			 * nodes that will be violated if we move the edge.
			 */
			if (target != 0 && !use_conflict(ep->pred, target)) {
				opt_state->done = 0;
				ep->succ = target;
				if (JT(target) != 0)
					/*
					 * Start over unless we hit a leaf.
					 */
					goto top;
				return;
			}
		}
	}
}